

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

QByteArray * __thiscall
QProcess::readAllStandardError(QByteArray *__return_storage_ptr__,QProcess *this)

{
  int channel;
  QObjectData *pQVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QProcessPrivate *d;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(char *)((long)&pQVar1[8].children.d.ptr + 7) == '\x01') {
    local_48.context.version = 2;
    local_48.context.line = 0;
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.function._4_4_ = 0;
    local_48.context.category = "default";
    QMessageLogger::warning(&local_48,"QProcess::readAllStandardError: Called with MergedChannels");
  }
  else {
    channel = *(int *)&pQVar1[2].parent;
    QIODevice::setCurrentReadChannel(&this->super_QIODevice,1);
    QIODevice::readAll((QByteArray *)&local_48,&this->super_QIODevice);
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    pDVar4 = (Data *)CONCAT44(local_48.context.line,local_48.context.version);
    local_48.context.version = (int)data;
    local_48.context.line = (int)((ulong)data >> 0x20);
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr =
         (char *)CONCAT44(local_48.context.file._4_4_,local_48.context.file._0_4_);
    local_48.context.file._0_4_ = SUB84(pcVar2,0);
    local_48.context.file._4_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size =
         CONCAT44(local_48.context.function._4_4_,local_48.context.function._0_4_);
    local_48.context.function._0_4_ = (undefined4)qVar3;
    local_48.context.function._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
    QIODevice::setCurrentReadChannel(&this->super_QIODevice,channel);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QProcess::readAllStandardError()
{
    Q_D(QProcess);
    QByteArray data;
    if (d->processChannelMode == MergedChannels) {
        qWarning("QProcess::readAllStandardError: Called with MergedChannels");
    } else {
        ProcessChannel tmp = readChannel();
        setReadChannel(StandardError);
        data = readAll();
        setReadChannel(tmp);
    }
    return data;
}